

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O3

boolean is_racial_weapon(obj *otmp,monst *mtmp)

{
  uint uVar1;
  
  if (mtmp == &youmonst) {
    if (urace.malenum != 0x111) {
      if (urace.malenum == 0x4a) goto LAB_001b42e4;
      if (urace.malenum != 0x2d) {
        return '\0';
      }
      goto LAB_001b42a2;
    }
  }
  else {
    if (mtmp == (monst *)0x0) {
      return '\0';
    }
    uVar1 = mtmp->data->mflags2;
    if ((uVar1 & 0x20) != 0) {
LAB_001b42a2:
      if (0x33 < (ulong)(ushort)otmp->otyp) {
        return '\0';
      }
      if ((0x8000100002000U >> ((ulong)(ushort)otmp->otyp & 0x3f) & 1) == 0) {
        return '\0';
      }
      return '\x01';
    }
    if ((uVar1 & 0x10) == 0) {
      if ((uVar1 & 0xc0) != 0x80) {
        return '\0';
      }
LAB_001b42e4:
      uVar1 = (ushort)otmp->otyp - 0xc;
      if ((uVar1 < 0x39) && ((0x100000000080081U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
        return '\x01';
      }
      if (otmp->otyp != 3) {
        return '\0';
      }
      return '\x01';
    }
  }
  uVar1 = (ushort)otmp->otyp - 0xb;
  if (((0x38 < uVar1) || ((0x100000004080081U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
     (otmp->otyp != 2)) {
    return '\0';
  }
  return '\x01';
}

Assistant:

boolean is_racial_weapon(const struct obj *otmp, const struct monst *mtmp)
{
	if (mtmp == &youmonst) {
	    if (Race_if(PM_DWARF)) return is_dwarvish_weapon(otmp);
	    else if (Race_if(PM_ELF)) return is_elven_weapon(otmp);
	    else if (Race_if(PM_GNOME)) return is_gnomish_weapon(otmp);
	    else if (Race_if(PM_ORC)) return is_orcish_weapon(otmp);
	} else if (mtmp) {
	    const struct permonst *mdat = mtmp->data;
	    if (is_dwarf(mdat)) return is_dwarvish_weapon(otmp);
	    else if (is_elf(mdat)) return is_elven_weapon(otmp);
	    else if (is_gnome(mdat)) return is_gnomish_weapon(otmp);
	    else if (is_orc(mdat)) return is_orcish_weapon(otmp);
	}
	return FALSE;
}